

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::TParseContext::blockStageIoCheck(TParseContext *this,TSourceLoc *loc,TQualifier *qualifier)

{
  EShLanguage EVar1;
  int minVersion;
  int profileMask;
  EShLanguageMask languageMask;
  char *pcVar2;
  _func_int *UNRECOVERED_JUMPTABLE;
  char *pcVar3;
  char *extsrt [2];
  
  extsrt[0]._0_4_ = 0x5f62ed;
  extsrt[0]._4_4_ = 0;
  extsrt[1]._0_4_ = 0x5f5648;
  extsrt[1]._4_4_ = 0;
  switch(*(uint *)&qualifier->field_0x8 & 0x7f) {
  case 3:
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,-9,0x96,"GL_ARB_separate_shader_objects","input block");
    TParseVersions::requireStage
              ((TParseVersions *)this,loc,
               EShLangMeshMask|EShLangFragmentMask|EShLangGeometryMask|EShLangTessEvaluationMask|
               EShLangTessControlMask,"input block");
    EVar1 = (this->super_TParseContextBase).super_TParseVersions.language;
    if (EVar1 != EShLangMesh) {
      if (EVar1 != EShLangFragment) {
        return;
      }
      pcVar3 = "fragment input block";
LAB_003b079e:
      TParseVersions::profileRequires
                ((TParseVersions *)this,loc,8,0x140,2,(char **)AEP_shader_io_blocks,pcVar3);
      return;
    }
    if ((qualifier->field_0xd & 8) != 0) {
      return;
    }
    UNRECOVERED_JUMPTABLE =
         (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
    pcVar2 = "input blocks cannot be used in a mesh shader";
    goto LAB_003b08fa;
  case 4:
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,-9,0x96,"GL_ARB_separate_shader_objects","output block");
    TParseVersions::requireStage
              ((TParseVersions *)this,loc,
               EShLangMeshMask|EShLangTaskMask|EShLangGeometryMask|EShLangTessEvaluationMask|
               EShLangTessControlMask|EShLangVertexMask,"output block");
    EVar1 = (this->super_TParseContextBase).super_TParseVersions.language;
    if (EVar1 == EShLangMesh) {
      if ((qualifier->field_0xd & 8) == 0) {
        return;
      }
      UNRECOVERED_JUMPTABLE =
           (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
      pcVar2 = "can only use on input blocks in mesh shader";
      pcVar3 = "taskNV";
      goto LAB_003b0922;
    }
    if (EVar1 != EShLangTask) {
      if (EVar1 != EShLangVertex) {
        return;
      }
      if ((this->super_TParseContextBase).parsingBuiltins != false) {
        return;
      }
      pcVar3 = "vertex output block";
      goto LAB_003b079e;
    }
    if ((qualifier->field_0xd & 8) != 0) {
      return;
    }
    UNRECOVERED_JUMPTABLE =
         (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
    pcVar2 = "output blocks cannot be used in a task shader";
LAB_003b08fa:
    pcVar3 = "out";
LAB_003b0922:
    (*UNRECOVERED_JUMPTABLE)(this,loc,pcVar2,pcVar3,"",UNRECOVERED_JUMPTABLE);
    return;
  case 5:
    TParseVersions::profileRequires((TParseVersions *)this,loc,8,300,(char *)0x0,"uniform block");
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,1,0x8c,"GL_ARB_uniform_buffer_object","uniform block");
    if (((this->currentBlockQualifier).field_0x10 & 0xf) != 3) {
      return;
    }
    if ((this->currentBlockQualifier).layoutPushConstant != false) {
      return;
    }
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
              (this,loc,1,&E_GL_EXT_scalar_block_layout,
               "std430 requires the buffer storage qualifier");
    return;
  case 6:
    TParseVersions::requireProfile((TParseVersions *)this,loc,0xe,"buffer block");
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,6,0x1ae,"GL_ARB_shader_storage_buffer_object",
               "buffer block");
    profileMask = 8;
    minVersion = 0x136;
    pcVar3 = (char *)0x0;
    pcVar2 = "buffer block";
    goto LAB_003b069d;
  case 7:
    if ((this->super_TParseContextBase).super_TParseVersions.spvVersion.spv - 1 < 0x103ff) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"shared block requires at least SPIR-V 1.4","shared block","");
    }
    pcVar3 = "GL_EXT_shared_memory_block";
    pcVar2 = "shared block";
    profileMask = 0xe;
    minVersion = 0;
LAB_003b069d:
    TParseVersions::profileRequires((TParseVersions *)this,loc,profileMask,minVersion,pcVar3,pcVar2)
    ;
    return;
  default:
    pcVar3 = (this->blockName->_M_dataplus)._M_p;
    UNRECOVERED_JUMPTABLE =
         (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
    pcVar2 = "only uniform, buffer, in, or out blocks are supported";
    goto LAB_003b0922;
  case 9:
    pcVar3 = "rayPayloadNV block";
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,-9,0x1cc,2,extsrt,"rayPayloadNV block");
    languageMask = EShLangMissMask|EShLangClosestHitMask|EShLangAnyHitMask|EShLangRayGenMask;
    break;
  case 10:
    pcVar3 = "rayPayloadInNV block";
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,-9,0x1cc,2,extsrt,"rayPayloadInNV block");
    languageMask = EShLangMissMask|EShLangClosestHitMask|EShLangAnyHitMask;
    break;
  case 0xb:
    pcVar3 = "hitAttributeNV block";
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,-9,0x1cc,2,extsrt,"hitAttributeNV block");
    languageMask = EShLangClosestHitMask|EShLangAnyHitMask|EShLangIntersectMask;
    break;
  case 0xc:
    pcVar3 = "callableDataNV block";
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,-9,0x1cc,2,extsrt,"callableDataNV block");
    languageMask = EShLangCallableMask|EShLangMissMask|EShLangClosestHitMask|EShLangRayGenMask;
    break;
  case 0xd:
    pcVar3 = "callableDataInNV block";
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,-9,0x1cc,2,extsrt,"callableDataInNV block");
    languageMask = EShLangCallableMask;
    break;
  case 0xe:
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,-9,0x1cc,"GL_NV_shader_invocation_reorder",
               "hitObjectAttributeNV block");
    TParseVersions::requireStage
              ((TParseVersions *)this,loc,EShLangMissMask|EShLangClosestHitMask|EShLangRayGenMask,
               "hitObjectAttributeNV block");
    return;
  }
  TParseVersions::requireStage((TParseVersions *)this,loc,languageMask,pcVar3);
  return;
}

Assistant:

void TParseContext::blockStageIoCheck(const TSourceLoc& loc, const TQualifier& qualifier)
{
    const char *extsrt[2] = { E_GL_NV_ray_tracing, E_GL_EXT_ray_tracing };
    switch (qualifier.storage) {
    case EvqUniform:
        profileRequires(loc, EEsProfile, 300, nullptr, "uniform block");
        profileRequires(loc, ENoProfile, 140, E_GL_ARB_uniform_buffer_object, "uniform block");
        if (currentBlockQualifier.layoutPacking == ElpStd430 && ! currentBlockQualifier.isPushConstant())
            requireExtensions(loc, 1, &E_GL_EXT_scalar_block_layout, "std430 requires the buffer storage qualifier");
        break;
    case EvqBuffer:
        requireProfile(loc, EEsProfile | ECoreProfile | ECompatibilityProfile, "buffer block");
        profileRequires(loc, ECoreProfile | ECompatibilityProfile, 430, E_GL_ARB_shader_storage_buffer_object, "buffer block");
        profileRequires(loc, EEsProfile, 310, nullptr, "buffer block");
        break;
    case EvqVaryingIn:
        profileRequires(loc, ~EEsProfile, 150, E_GL_ARB_separate_shader_objects, "input block");
        // It is a compile-time error to have an input block in a vertex shader or an output block in a fragment shader
        // "Compute shaders do not permit user-defined input variables..."
        requireStage(loc, (EShLanguageMask)(EShLangTessControlMask|EShLangTessEvaluationMask|EShLangGeometryMask|
            EShLangFragmentMask|EShLangMeshMask), "input block");
        if (language == EShLangFragment) {
            profileRequires(loc, EEsProfile, 320, Num_AEP_shader_io_blocks, AEP_shader_io_blocks, "fragment input block");
        } else if (language == EShLangMesh && ! qualifier.isTaskMemory()) {
            error(loc, "input blocks cannot be used in a mesh shader", "out", "");
        }
        break;
    case EvqVaryingOut:
        profileRequires(loc, ~EEsProfile, 150, E_GL_ARB_separate_shader_objects, "output block");
        requireStage(loc, (EShLanguageMask)(EShLangVertexMask|EShLangTessControlMask|EShLangTessEvaluationMask|
            EShLangGeometryMask|EShLangMeshMask|EShLangTaskMask), "output block");
        // ES 310 can have a block before shader_io is turned on, so skip this test for built-ins
        if (language == EShLangVertex && ! parsingBuiltins) {
            profileRequires(loc, EEsProfile, 320, Num_AEP_shader_io_blocks, AEP_shader_io_blocks, "vertex output block");
        } else if (language == EShLangMesh && qualifier.isTaskMemory()) {
            error(loc, "can only use on input blocks in mesh shader", "taskNV", "");
        } else if (language == EShLangTask && ! qualifier.isTaskMemory()) {
            error(loc, "output blocks cannot be used in a task shader", "out", "");
        }
        break;
    case EvqShared:
        if (spvVersion.spv > 0 && spvVersion.spv < EShTargetSpv_1_4) {
            error(loc, "shared block requires at least SPIR-V 1.4", "shared block", "");
        }
        profileRequires(loc, EEsProfile | ECoreProfile | ECompatibilityProfile, 0, E_GL_EXT_shared_memory_block, "shared block");
        break;
    case EvqPayload:
        profileRequires(loc, ~EEsProfile, 460, 2, extsrt, "rayPayloadNV block");
        requireStage(loc, (EShLanguageMask)(EShLangRayGenMask | EShLangAnyHitMask | EShLangClosestHitMask | EShLangMissMask),
            "rayPayloadNV block");
        break;
    case EvqPayloadIn:
        profileRequires(loc, ~EEsProfile, 460, 2, extsrt, "rayPayloadInNV block");
        requireStage(loc, (EShLanguageMask)(EShLangAnyHitMask | EShLangClosestHitMask | EShLangMissMask),
            "rayPayloadInNV block");
        break;
    case EvqHitAttr:
        profileRequires(loc, ~EEsProfile, 460, 2, extsrt, "hitAttributeNV block");
        requireStage(loc, (EShLanguageMask)(EShLangIntersectMask | EShLangAnyHitMask | EShLangClosestHitMask), "hitAttributeNV block");
        break;
    case EvqCallableData:
        profileRequires(loc, ~EEsProfile, 460, 2, extsrt, "callableDataNV block");
        requireStage(loc, (EShLanguageMask)(EShLangRayGenMask | EShLangClosestHitMask | EShLangMissMask | EShLangCallableMask),
            "callableDataNV block");
        break;
    case EvqCallableDataIn:
        profileRequires(loc, ~EEsProfile, 460, 2, extsrt, "callableDataInNV block");
        requireStage(loc, (EShLanguageMask)(EShLangCallableMask), "callableDataInNV block");
        break;
    case EvqHitObjectAttrNV:
        profileRequires(loc, ~EEsProfile, 460, E_GL_NV_shader_invocation_reorder, "hitObjectAttributeNV block");
        requireStage(loc, (EShLanguageMask)(EShLangRayGenMask | EShLangClosestHitMask | EShLangMissMask), "hitObjectAttributeNV block");
        break;
    default:
        error(loc, "only uniform, buffer, in, or out blocks are supported", blockName->c_str(), "");
        break;
    }
}